

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall
CTtRenderMeshInfoUserData::CTtRenderMeshInfoUserData(CTtRenderMeshInfoUserData *this)

{
  ON_UUID OVar1;
  
  ON_UserData::ON_UserData(&this->super_ON_UserData);
  (this->super_ON_UserData).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00825470;
  ON_RenderMeshInfo::ON_RenderMeshInfo(&this->m_info);
  (this->super_ON_UserData).m_application_uuid.Data1 = 0x50ede5c9;
  (this->super_ON_UserData).m_application_uuid.Data2 = 0x1487;
  (this->super_ON_UserData).m_application_uuid.Data3 = 0x4b4c;
  (this->super_ON_UserData).m_application_uuid.Data4[0] = 0xb3;
  (this->super_ON_UserData).m_application_uuid.Data4[1] = 0xaa;
  (this->super_ON_UserData).m_application_uuid.Data4[2] = 'h';
  (this->super_ON_UserData).m_application_uuid.Data4[3] = '@';
  (this->super_ON_UserData).m_application_uuid.Data4[4] = 0xb4;
  (this->super_ON_UserData).m_application_uuid.Data4[5] = '`';
  (this->super_ON_UserData).m_application_uuid.Data4[6] = 0xe3;
  (this->super_ON_UserData).m_application_uuid.Data4[7] = 0xcf;
  OVar1 = ON_ClassId::Uuid(&m_CTtRenderMeshInfoUserData_class_rtti);
  (this->super_ON_UserData).m_userdata_uuid = OVar1;
  (this->super_ON_UserData).m_userdata_copycount = 1;
  return;
}

Assistant:

CTtRenderMeshInfoUserData()
  {
    m_application_uuid = ON_opennurbs_id;
    m_userdata_uuid = ON_CLASS_ID(CTtRenderMeshInfoUserData);
    m_userdata_copycount = 1;
  }